

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

iterator * __thiscall
idx2::Insert<unsigned_int,idx2::channel>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<unsigned_int,_idx2::channel> *Ht,
          uint *Key,channel *Val)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = (byte)*(undefined8 *)(this + 0x20);
  if (7L << (bVar2 & 0x3f) <= *(long *)(this + 0x18) * 10) {
    IncreaseCapacity<unsigned_int,idx2::channel>((hash_table<unsigned_int,_idx2::channel> *)this);
    bVar2 = (byte)*(undefined8 *)(this + 0x20);
  }
  uVar1 = *(uint *)&Ht->Keys;
  for (uVar3 = (ulong)uVar1 * -0x61c8864680b583eb >> (-bVar2 & 0x3f);
      (*(char *)(*(long *)(this + 0x10) + uVar3) == '\x02' &&
      (*(uint *)(*(long *)this + uVar3 * 4) != uVar1)); uVar3 = uVar3 + 1 & ~(-1L << (bVar2 & 0x3f))
      ) {
  }
  *(uint *)(*(long *)this + uVar3 * 4) = uVar1;
  memcpy((void *)(*(long *)(this + 8) + uVar3 * 0xd8),Key,0xd4);
  if (*(char *)(*(long *)(this + 0x10) + uVar3) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + uVar3) = 2;
  }
  __return_storage_ptr__->Key = (uint *)(uVar3 * 4 + *(long *)this);
  __return_storage_ptr__->Val = (channel *)(uVar3 * 0xd8 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_int,_idx2::channel> *)this;
  __return_storage_ptr__->Idx = uVar3;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}